

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChronoFPSLimiter.cpp
# Opt level: O3

void __thiscall
solitaire::time::ChronoFPSLimiter::ChronoFPSLimiter
          (ChronoFPSLimiter *this,uint fps,
          unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
          *stdTimeFunctionsWrapper)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->super_FPSLimiter)._vptr_FPSLimiter = (_func_int **)&PTR__ChronoFPSLimiter_00115cc8;
  this->frameTime = 1000.0 / (double)fps;
  (this->stdTimeFunctionsWrapper)._M_t.
  super___uniq_ptr_impl<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
  .super__Head_base<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_false>._M_head_impl
       = (stdTimeFunctionsWrapper->_M_t).
         super___uniq_ptr_impl<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
         ._M_t.
         super__Tuple_impl<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
         .super__Head_base<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_false>.
         _M_head_impl;
  (stdTimeFunctionsWrapper->_M_t).
  super___uniq_ptr_impl<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
  .super__Head_base<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_false>._M_head_impl
       = (StdTimeFunctionsWrapper *)0x0;
  iVar1 = (*((this->stdTimeFunctionsWrapper)._M_t.
             super___uniq_ptr_impl<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
             .super__Head_base<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_false>.
            _M_head_impl)->_vptr_StdTimeFunctionsWrapper[2])();
  (this->frameStartTime).__d.__r = CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

ChronoFPSLimiter::ChronoFPSLimiter(
    const unsigned fps,
    std::unique_ptr<StdTimeFunctionsWrapper> stdTimeFunctionsWrapper):
        frameTime {1000.0 / fps},
        stdTimeFunctionsWrapper {std::move(stdTimeFunctionsWrapper)},
        frameStartTime {this->stdTimeFunctionsWrapper->now()} {
}